

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O2

void GLPortal::StartFrame(void)

{
  GLPortal *p;
  GLPortal *local_8;
  
  local_8 = (GLPortal *)0x0;
  TArray<GLPortal_*,_GLPortal_*>::Push(&portals,&local_8);
  if (renderdepth == 0) {
    inskybox = false;
    instack[0] = 0;
    instack[1] = 0;
  }
  renderdepth = renderdepth + 1;
  return;
}

Assistant:

void GLPortal::StartFrame()
{
	GLPortal * p=NULL;
	portals.Push(p);
	if (renderdepth==0)
	{
		inskybox=false;
		instack[sector_t::floor]=instack[sector_t::ceiling]=0;
	}
	renderdepth++;
}